

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O2

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  size_t _elemsize;
  Mat *pMVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int *piVar10;
  size_t b_2;
  size_t sVar11;
  ulong uVar12;
  void *pvVar13;
  size_t b;
  ulong uVar14;
  void *pvVar15;
  bool bVar16;
  int local_b0;
  Mat local_78;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pMVar4->dims;
  _elemsize = pMVar4->elemsize;
  if (uVar1 == 1) {
    lVar6 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48;
    piVar10 = &pMVar4->w;
    iVar9 = 0;
    while (bVar16 = lVar6 != 0, lVar6 = lVar6 + -1, bVar16) {
      iVar9 = iVar9 + *piVar10;
      piVar10 = piVar10 + 0x12;
    }
    pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar5,iVar9,_elemsize,opt->blob_allocator);
    pvVar15 = pMVar5->data;
    local_b0 = -100;
    if ((pvVar15 != (void *)0x0) && ((long)pMVar5->c * pMVar5->cstep != 0)) {
      local_b0 = 0;
      lVar6 = 0;
      for (uVar14 = 0;
          pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start,
          uVar14 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48);
          uVar14 = uVar14 + 1) {
        sVar11 = (long)*(int *)((long)&pMVar4->w + lVar6) * _elemsize;
        memcpy(pvVar15,*(void **)((long)&pMVar4->data + lVar6),sVar11);
        pvVar15 = (void *)((long)pvVar15 + sVar11);
        lVar6 = lVar6 + 0x48;
      }
    }
  }
  else {
    iVar9 = (this->axis >> 0x1f & uVar1) + this->axis;
    if ((uVar1 == 2) && (iVar9 == 0)) {
      iVar9 = pMVar4->w;
      lVar6 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48;
      piVar10 = &pMVar4->h;
      iVar7 = 0;
      while (bVar16 = lVar6 != 0, lVar6 = lVar6 + -1, bVar16) {
        iVar7 = iVar7 + *piVar10;
        piVar10 = piVar10 + 0x12;
      }
      pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar5,iVar9,iVar7,_elemsize,opt->blob_allocator);
      pvVar15 = pMVar5->data;
      local_b0 = -100;
      if ((pvVar15 != (void *)0x0) && ((long)pMVar5->c * pMVar5->cstep != 0)) {
        local_b0 = 0;
        lVar6 = 0;
        for (uVar14 = 0;
            pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            uVar14 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48
                            ); uVar14 = uVar14 + 1) {
          sVar11 = (long)*(int *)((long)&pMVar4->h + lVar6) * _elemsize * (long)iVar9;
          memcpy(pvVar15,*(void **)((long)&pMVar4->data + lVar6),sVar11);
          pvVar15 = (void *)((long)pvVar15 + sVar11);
          lVar6 = lVar6 + 0x48;
        }
      }
    }
    else if ((uVar1 == 2) && (iVar9 == 1)) {
      uVar1 = pMVar4->h;
      lVar6 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48;
      piVar10 = &pMVar4->w;
      iVar9 = 0;
      while (bVar16 = lVar6 != 0, lVar6 = lVar6 + -1, bVar16) {
        iVar9 = iVar9 + *piVar10;
        piVar10 = piVar10 + 0x12;
      }
      pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar5,iVar9,uVar1,_elemsize,opt->blob_allocator);
      local_b0 = -100;
      if ((pMVar5->data != (void *)0x0) && ((long)pMVar5->c * pMVar5->cstep != 0)) {
        local_b0 = 0;
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        for (uVar14 = 0; uVar14 != uVar1; uVar14 = uVar14 + 1) {
          pvVar15 = (void *)((long)pMVar5->w * uVar14 * pMVar5->elemsize + (long)pMVar5->data);
          lVar6 = 0x2c;
          uVar12 = 0;
          while( true ) {
            pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48) <= uVar12)
            break;
            lVar8 = (long)*(int *)((long)&pMVar4->data + lVar6);
            memcpy(pvVar15,(void *)(uVar14 * lVar8 * *(long *)((long)pMVar4 + lVar6 + -0x1c) +
                                   *(long *)((long)pMVar4 + lVar6 + -0x2c)),lVar8 * _elemsize);
            pvVar15 = (void *)((long)pvVar15 +
                              (long)*(int *)((long)&pMVar4->data + lVar6) * _elemsize);
            uVar12 = uVar12 + 1;
            lVar6 = lVar6 + 0x48;
          }
        }
      }
    }
    else if ((uVar1 == 3) && (iVar9 == 0)) {
      lVar6 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48;
      piVar10 = &pMVar4->c;
      iVar9 = 0;
      while (bVar16 = lVar6 != 0, lVar6 = lVar6 + -1, bVar16) {
        iVar9 = iVar9 + *piVar10;
        piVar10 = piVar10 + 0x12;
      }
      pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar5,pMVar4->w,pMVar4->h,iVar9,_elemsize,opt->blob_allocator);
      local_b0 = -100;
      if ((pMVar5->data != (void *)0x0) && ((long)pMVar5->c * pMVar5->cstep != 0)) {
        local_b0 = 0;
        lVar6 = 0x40;
        uVar14 = 0;
        iVar9 = 0;
        while( true ) {
          pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          if ((ulong)(((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48) <= uVar14)
          break;
          iVar7 = *(int *)((long)pMVar4 + lVar6 + -8);
          pvVar15 = *(void **)((long)pMVar4 + lVar6 + -0x40);
          lVar8 = *(long *)((long)&pMVar4->data + lVar6);
          Mat::channel(&local_78,pMVar5,iVar9);
          pvVar13 = local_78.data;
          Mat::~Mat(&local_78);
          memcpy(pvVar13,pvVar15,(long)iVar7 * _elemsize * lVar8);
          iVar9 = iVar9 + iVar7;
          uVar14 = uVar14 + 1;
          lVar6 = lVar6 + 0x48;
        }
      }
    }
    else if ((uVar1 == 3) && (iVar9 == 1)) {
      iVar9 = pMVar4->c;
      lVar6 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48;
      piVar10 = &pMVar4->h;
      iVar7 = 0;
      while (bVar16 = lVar6 != 0, lVar6 = lVar6 + -1, bVar16) {
        iVar7 = iVar7 + *piVar10;
        piVar10 = piVar10 + 0x12;
      }
      pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar5,pMVar4->w,iVar7,iVar9,_elemsize,opt->blob_allocator);
      local_b0 = -100;
      if ((pMVar5->data != (void *)0x0) && ((long)pMVar5->c * pMVar5->cstep != 0)) {
        local_b0 = 0;
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        for (iVar7 = 0; iVar7 != iVar9; iVar7 = iVar7 + 1) {
          Mat::channel(&local_78,pMVar5,iVar7);
          pvVar15 = local_78.data;
          Mat::~Mat(&local_78);
          lVar6 = 0;
          uVar14 = 0;
          while( true ) {
            pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48) <= uVar14)
            break;
            iVar2 = *(int *)((long)&pMVar4->w + lVar6);
            iVar3 = *(int *)((long)&pMVar4->h + lVar6);
            Mat::channel(&local_78,(Mat *)((long)&pMVar4->data + lVar6),iVar7);
            pvVar13 = local_78.data;
            Mat::~Mat(&local_78);
            sVar11 = (long)iVar3 * (long)iVar2 * _elemsize;
            memcpy(pvVar15,pvVar13,sVar11);
            pvVar15 = (void *)((long)pvVar15 + sVar11);
            uVar14 = uVar14 + 1;
            lVar6 = lVar6 + 0x48;
          }
        }
      }
    }
    else {
      local_b0 = 0;
      if ((uVar1 == 3) && (iVar9 == 2)) {
        uVar1 = pMVar4->h;
        iVar9 = pMVar4->c;
        lVar6 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48;
        piVar10 = &pMVar4->w;
        iVar7 = 0;
        while (bVar16 = lVar6 != 0, lVar6 = lVar6 + -1, bVar16) {
          iVar7 = iVar7 + *piVar10;
          piVar10 = piVar10 + 0x12;
        }
        pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Mat::create(pMVar5,iVar7,uVar1,iVar9,_elemsize,opt->blob_allocator);
        local_b0 = -100;
        if ((pMVar5->data != (void *)0x0) && ((long)pMVar5->c * pMVar5->cstep != 0)) {
          if ((int)uVar1 < 1) {
            uVar1 = 0;
          }
          local_b0 = 0;
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          for (iVar7 = 0; iVar7 != iVar9; iVar7 = iVar7 + 1) {
            Mat::channel(&local_78,pMVar5,iVar7);
            pvVar15 = local_78.data;
            Mat::~Mat(&local_78);
            for (uVar14 = 0; uVar14 != uVar1; uVar14 = uVar14 + 1) {
              lVar6 = 0;
              uVar12 = 0;
              while( true ) {
                pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                if ((ulong)(((long)(bottom_blobs->
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48)
                    <= uVar12) break;
                Mat::channel(&local_78,(Mat *)((long)&pMVar4->data + lVar6),iVar7);
                pvVar13 = (void *)((long)local_78.w * uVar14 * local_78.elemsize +
                                  (long)local_78.data);
                Mat::~Mat(&local_78);
                memcpy(pvVar15,pvVar13,(long)*(int *)((long)&pMVar4->w + lVar6) * _elemsize);
                pvVar15 = (void *)((long)pvVar15 +
                                  (long)*(int *)((long)&pMVar4->w + lVar6) * _elemsize);
                uVar12 = uVar12 + 1;
                lVar6 = lVar6 + 0x48;
              }
            }
          }
        }
      }
    }
  }
  return local_b0;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w * elemsize;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size * elemsize;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            unsigned char* outptr = top_blob.row<unsigned char>(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const unsigned char* ptr = bottom_blob.row<const unsigned char>(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elemsize;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int q = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            size_t size = bottom_blob.cstep * channels;

            const unsigned char* ptr = bottom_blob;
            unsigned char* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const unsigned char* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elemsize;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const unsigned char* ptr = bottom_blob.channel(q).row<const unsigned char>(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w * elemsize;
                }
            }
        }

        return 0;
    }

    return 0;
}